

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_misc.c
# Opt level: O0

void pcre2_jit_stack_assign_8
               (pcre2_match_context_8 *mcontext,pcre2_jit_callback_8 callback,void *callback_data)

{
  void *callback_data_local;
  pcre2_jit_callback_8 callback_local;
  pcre2_match_context_8 *mcontext_local;
  
  return;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_jit_stack_assign(pcre2_match_context *mcontext, pcre2_jit_callback callback,
  void *callback_data)
{
#ifndef SUPPORT_JIT
(void)mcontext;
(void)callback;
(void)callback_data;
#else  /* SUPPORT_JIT */

if (mcontext == NULL) return;
mcontext->jit_callback = callback;
mcontext->jit_callback_data = callback_data;

#endif  /* SUPPORT_JIT */
}